

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O3

ssize_t __thiscall vox::nSHP::write(nSHP *this,int __fd,void *__buf,size_t __n)

{
  pointer pMVar1;
  size_t sVar2;
  FILE *pFVar3;
  void *__buf_00;
  void *__buf_01;
  undefined4 in_register_00000034;
  FILE *__s;
  long lVar4;
  long lVar5;
  int32_t id;
  size_t childSize;
  size_t contentSize;
  undefined4 local_3c;
  undefined8 local_38;
  size_t local_30;
  
  __s = (FILE *)CONCAT44(in_register_00000034,__fd);
  local_3c = 0x5048536e;
  fwrite(&local_3c,4,1,__s);
  local_30 = getSize(this);
  fwrite(&local_30,4,1,__s);
  local_38 = 0;
  fwrite(&local_38,4,1,__s);
  pFVar3 = __s;
  fwrite(this,4,1,__s);
  DICT::write(&this->nodeAttribs,__fd,__buf_00,(size_t)pFVar3);
  sVar2 = fwrite(&this->numModels,4,1,__s);
  if (0 < this->numModels) {
    lVar4 = 8;
    lVar5 = 0;
    do {
      pMVar1 = (this->models).super__Vector_base<vox::MODEL,_std::allocator<vox::MODEL>_>._M_impl.
               super__Vector_impl_data._M_start;
      pFVar3 = __s;
      fwrite((void *)((long)pMVar1 + lVar4 + -8),4,1,__s);
      DICT::write((DICT *)((long)&pMVar1->modelId + lVar4),__fd,__buf_01,(size_t)pFVar3);
      lVar5 = lVar5 + 1;
      sVar2 = (size_t)this->numModels;
      lVar4 = lVar4 + 0x28;
    } while (lVar5 < (long)sVar2);
  }
  return sVar2;
}

Assistant:

void nSHP::write(FILE* fp) {
    // chunk header
    int32_t id = GetMVID('n', 'S', 'H', 'P');
    fwrite(&id, sizeof(int32_t), 1, fp);
    size_t contentSize = getSize();
    fwrite(&contentSize, sizeof(int32_t), 1, fp);
    size_t childSize = 0;
    fwrite(&childSize, sizeof(int32_t), 1, fp);

    // datas's
    fwrite(&nodeId, sizeof(int32_t), 1, fp);
    nodeAttribs.write(fp);
    fwrite(&numModels, sizeof(int32_t), 1, fp);
    for (int i = 0; i < numModels; i++)
        models[i].write(fp);
}